

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend,int bIntToNull)

{
  u8 uVar1;
  sqlite3 *db;
  Expr *p;
  int iVar2;
  Expr *pEVar3;
  ExprList_item *pEVar4;
  long lVar5;
  long in_FS_OFFSET;
  int iDummy;
  long local_60;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      local_60 = 0;
    }
    else {
      local_60 = (long)pList->nExpr;
    }
    if (0 < pAppend->nExpr) {
      lVar5 = 0;
      do {
        db = pParse->db;
        pEVar3 = pAppend->a[lVar5].pExpr;
        if (pEVar3 == (Expr *)0x0) {
          pEVar3 = (Expr *)0x0;
        }
        else {
          pEVar3 = exprDup(db,pEVar3,0,(EdupBuf *)0x0);
        }
        uVar1 = db->mallocFailed;
        if (uVar1 == '\0') {
          if (bIntToNull != 0) {
            local_3c = -0x55555556;
            p = pEVar3;
            while ((p != (Expr *)0x0 && ((p->flags & 0x82000) != 0))) {
              if ((p->flags >> 0x13 & 1) == 0) {
                if (p->op != 'r') break;
                pEVar4 = (ExprList_item *)&p->pLeft;
              }
              else {
                pEVar4 = ((p->x).pList)->a;
              }
              p = pEVar4->pExpr;
            }
            iVar2 = sqlite3ExprIsInteger(p,&local_3c,(Parse *)0x0);
            if (iVar2 != 0) {
              p->op = 'z';
              p->flags = p->flags & 0xcffff7ff;
              (p->u).zToken = (char *)0x0;
            }
          }
          pList = sqlite3ExprListAppend(pParse,pList,pEVar3);
          if (pList != (ExprList *)0x0) {
            pList->a[local_60 + lVar5].fg.sortFlags = pAppend->a[lVar5].fg.sortFlags;
          }
        }
        else if (pEVar3 != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,pEVar3);
        }
      } while ((uVar1 == '\0') && (lVar5 = lVar5 + 1, lVar5 < pAppend->nExpr));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pList;
  }
  __stack_chk_fail();
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend,      /* List of values to append. Might be NULL */
  int bIntToNull
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      sqlite3 *db = pParse->db;
      Expr *pDup = sqlite3ExprDup(db, pAppend->a[i].pExpr, 0);
      if( db->mallocFailed ){
        sqlite3ExprDelete(db, pDup);
        break;
      }
      if( bIntToNull ){
        int iDummy;
        Expr *pSub;
        pSub = sqlite3ExprSkipCollateAndLikely(pDup);
        if( sqlite3ExprIsInteger(pSub, &iDummy, 0) ){
          pSub->op = TK_NULL;
          pSub->flags &= ~(EP_IntValue|EP_IsTrue|EP_IsFalse);
          pSub->u.zToken = 0;
        }
      }
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].fg.sortFlags = pAppend->a[i].fg.sortFlags;
    }
  }
  return pList;
}